

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void XXH3_accumulate_512_sse2(void *acc,void *input,void *secret)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong *puVar4;
  long *plVar5;
  long *plVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong uVar7;
  ulong uVar9;
  undefined1 auVar8 [16];
  __m128i *xsecret;
  __m128i *xinput;
  __m128i *xacc;
  long lStack_130;
  ulong local_d0;
  __m128i sum;
  __m128i data_swap;
  __m128i product;
  __m128i data_key_lo;
  __m128i data_key;
  __m128i key_vec;
  __m128i data_vec;
  size_t i;
  
  for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
    puVar4 = (ulong *)(in_RSI + local_d0 * 0x10);
    uVar1 = *puVar4;
    uVar2 = puVar4[1];
    puVar4 = (ulong *)(in_RDX + local_d0 * 0x10);
    uVar7 = uVar1 ^ *puVar4;
    uVar9 = uVar2 ^ puVar4[1];
    auVar8._8_4_ = (int)uVar1;
    auVar8._0_8_ = uVar2;
    auVar8._12_4_ = (int)(uVar1 >> 0x20);
    plVar5 = (long *)(in_RDI + local_d0 * 0x10);
    lVar3 = plVar5[1];
    lStack_130 = auVar8._8_8_;
    plVar6 = (long *)(in_RDI + local_d0 * 0x10);
    *plVar6 = (uVar7 & 0xffffffff) * (uVar7 >> 0x20) + *plVar5 + uVar2;
    plVar6[1] = (uVar9 & 0xffffffff) * (uVar9 >> 0x20) + lVar3 + lStack_130;
  }
  return;
}

Assistant:

XXH_FORCE_INLINE XXH_TARGET_SSE2 void
XXH3_accumulate_512_sse2( void* XXH_RESTRICT acc,
                    const void* XXH_RESTRICT input,
                    const void* XXH_RESTRICT secret)
{
    /* SSE2 is just a half-scale version of the AVX2 version. */
    XXH_ASSERT((((size_t)acc) & 15) == 0);
    {   XXH_ALIGN(16) __m128i* const xacc    =       (__m128i *) acc;
        /* Unaligned. This is mainly for pointer arithmetic, and because
         * _mm_loadu_si128 requires a const __m128i * pointer for some reason. */
        const         __m128i* const xinput  = (const __m128i *) input;
        /* Unaligned. This is mainly for pointer arithmetic, and because
         * _mm_loadu_si128 requires a const __m128i * pointer for some reason. */
        const         __m128i* const xsecret = (const __m128i *) secret;

        size_t i;
        for (i=0; i < XXH_STRIPE_LEN/sizeof(__m128i); i++) {
            /* data_vec    = xinput[i]; */
            __m128i const data_vec    = _mm_loadu_si128   (xinput+i);
            /* key_vec     = xsecret[i]; */
            __m128i const key_vec     = _mm_loadu_si128   (xsecret+i);
            /* data_key    = data_vec ^ key_vec; */
            __m128i const data_key    = _mm_xor_si128     (data_vec, key_vec);
            /* data_key_lo = data_key >> 32; */
            __m128i const data_key_lo = _mm_shuffle_epi32 (data_key, _MM_SHUFFLE(0, 3, 0, 1));
            /* product     = (data_key & 0xffffffff) * (data_key_lo & 0xffffffff); */
            __m128i const product     = _mm_mul_epu32     (data_key, data_key_lo);
            /* xacc[i] += swap(data_vec); */
            __m128i const data_swap = _mm_shuffle_epi32(data_vec, _MM_SHUFFLE(1,0,3,2));
            __m128i const sum       = _mm_add_epi64(xacc[i], data_swap);
            /* xacc[i] += product; */
            xacc[i] = _mm_add_epi64(product, sum);
    }   }
}